

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O0

curl_off_t trspeed(curl_off_t size,curl_off_t us)

{
  curl_off_t us_local;
  curl_off_t size_local;
  
  if (us < 1) {
    size_local = size * 1000000;
  }
  else if (size < 0x8637bd05af6) {
    size_local = (size * 1000000) / us;
  }
  else if (us < 1000000) {
    size_local = 0x7fffffffffffffff;
  }
  else {
    size_local = size / (us / 1000000);
  }
  return size_local;
}

Assistant:

static curl_off_t trspeed(curl_off_t size, /* number of bytes */
                          curl_off_t us)   /* microseconds */
{
  if(us < 1)
    return size * 1000000;
  else if(size < CURL_OFF_T_MAX/1000000)
    return (size * 1000000) / us;
  else if(us >= 1000000)
    return size / (us / 1000000);
  else
    return CURL_OFF_T_MAX;
}